

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_csv2xlsx.c
# Opt level: O1

int main(int argc,char **argv)

{
  byte bVar1;
  char *__s;
  bool bVar2;
  int iVar3;
  __int32_t **pp_Var4;
  char *__s_00;
  char *pcVar5;
  size_t sVar6;
  long lVar7;
  void *pvVar8;
  long lVar9;
  byte bVar10;
  byte *pbVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  uchar bom [3];
  char buf [256];
  byte local_198;
  char local_197;
  char local_196;
  char local_195;
  int local_194;
  FILE *local_190;
  int local_184;
  char **local_180;
  void *local_178;
  long local_170;
  long local_168;
  undefined8 local_160;
  char *local_158;
  ulong local_150;
  char *local_148;
  undefined8 local_140;
  byte local_138 [264];
  
  if (argc == 1) {
LAB_00101399:
    printf("Usage:  xlsxio_csv2xlsx [-h] [-s separator] [-d rows] [-n] csvfile ...\nParameters:\n  -h          \tdisplay command line help\n  -s separator\tspecify separator to use (default is comma)\n  -d rows     \trows used for column width detection (default is %i)\n  -t          \ttread top row as header row\n  csvfile     \tpath to CSV file (multiple may be specified)\nDescription:\nConverts all specified CSV (Comma Separated Values) files to .xlsx files.\nVersion: 0.2.36\n\n"
           ,0x14);
  }
  else if (1 < argc) {
    local_198 = 0x2c;
    local_160 = 0;
    local_168 = 0x14;
    uVar16 = 1;
    local_194 = argc;
    local_180 = argv;
    do {
      uVar15 = (uint)uVar16;
      pbVar11 = (byte *)argv[(int)uVar15];
      if ((*pbVar11 | 2) == 0x2f) {
        pp_Var4 = __ctype_tolower_loc();
        iVar3 = (*pp_Var4)[(char)pbVar11[1]];
        if (iVar3 < 0x73) {
          if (iVar3 != 100) {
            if ((iVar3 != 0x3f) && (iVar3 != 0x68)) goto LAB_0010145f;
            goto LAB_00101399;
          }
          if (pbVar11[2] == 0) {
            uVar12 = uVar15 + 1;
            if ((local_194 <= (int)uVar12) ||
               (pbVar11 = (byte *)local_180[(int)uVar12], pbVar11 == (byte *)0x0)) {
              pbVar11 = (byte *)0x0;
              uVar12 = uVar15;
            }
          }
          else {
            pbVar11 = pbVar11 + 2;
            uVar12 = uVar15;
          }
          if (pbVar11 != (byte *)0x0) {
            local_168 = strtol((char *)pbVar11,(char **)0x0,10);
          }
          uVar13 = (ulong)uVar12;
          argv = local_180;
          argc = local_194;
        }
        else {
          uVar13 = uVar16;
          if (iVar3 == 0x74) {
            local_160 = 1;
          }
          else {
            if (iVar3 != 0x73) goto LAB_0010145f;
            if (pbVar11[2] == 0) {
              uVar15 = uVar15 + 1;
              if ((argc <= (int)uVar15) ||
                 (pbVar11 = (byte *)argv[(int)uVar15], uVar13 = (ulong)uVar15,
                 pbVar11 == (byte *)0x0)) {
                pbVar11 = (byte *)0x0;
                uVar13 = uVar16;
              }
            }
            else {
              pbVar11 = pbVar11 + 2;
            }
            if (pbVar11 != (byte *)0x0) {
              local_198 = *pbVar11;
            }
          }
        }
      }
      else {
LAB_0010145f:
        iVar3 = strcmp((char *)pbVar11,"-");
        if (iVar3 == 0) {
          local_190 = _stdin;
          __s_00 = strdup("Sheet1");
          pcVar5 = strdup("data.xlsx");
        }
        else {
          local_190 = fopen((char *)pbVar11,"rb");
          if (local_190 == (FILE *)0x0) {
            main_cold_2();
            local_190 = (FILE *)0x0;
            __s_00 = (char *)0x0;
            pcVar5 = (char *)0x0;
          }
          else {
            __s_00 = strdup(argv[(int)uVar15]);
            if (__s_00 != (char *)0x0) {
              pcVar5 = strrchr(__s_00,0x2e);
              if (pcVar5 != (char *)0x0) {
                *pcVar5 = '\0';
              }
              sVar6 = strlen(__s_00);
              lVar7 = (long)(int)sVar6;
              do {
                lVar14 = lVar7;
                if (lVar14 < 1) goto LAB_001014f2;
                lVar7 = lVar14 + -1;
              } while (__s_00[lVar14 + -1] != '/');
              memmove(__s_00,__s_00 + lVar14,sVar6 - (lVar14 + -1));
            }
LAB_001014f2:
            __s = argv[(int)uVar15];
            sVar6 = strlen(__s);
            pcVar5 = (char *)malloc(sVar6 + 6);
            if (pcVar5 == (char *)0x0) {
              main_cold_1();
              pcVar5 = (char *)0x0;
            }
            else {
              strcpy(pcVar5,__s);
              sVar6 = strlen(pcVar5);
              builtin_strncpy(pcVar5 + sVar6,".xlsx",6);
            }
          }
        }
        if (((__s_00 != (char *)0x0) && (local_190 != (FILE *)0x0)) && (pcVar5 != (char *)0x0)) {
          local_148 = pcVar5;
          lVar7 = xlsxiowrite_open();
          if (lVar7 != 0) {
            xlsxiowrite_set_detection_rows(lVar7,local_168);
            local_170 = lVar7;
            xlsxiowrite_set_row_height(lVar7,1);
            sVar6 = fread(&local_197,1,3,local_190);
            if (((sVar6 != 3) || (local_197 != -0x11)) ||
               ((local_196 != -0x45 || (local_195 != -0x41)))) {
              fseek(local_190,0,0);
            }
            local_158 = __s_00;
            local_150 = uVar16;
            sVar6 = fread(local_138,1,0x100,local_190);
            if (sVar6 == 0) {
              local_178 = (void *)0x0;
            }
            else {
              bVar2 = true;
              local_184 = 1;
              bVar10 = 0;
              lVar7 = 0;
              local_178 = (void *)0x0;
              do {
                local_140 = -(ulong)(sVar6 == 0) - sVar6;
                uVar13 = 1;
                lVar14 = 0;
                uVar16 = 0;
                pvVar8 = local_178;
                do {
                  bVar1 = local_138[uVar13 - 1];
                  if (bVar2) {
                    if (bVar1 == local_198 || bVar1 == 10) {
                      pvVar8 = realloc(pvVar8,uVar13 + (lVar7 - uVar16));
                      if (pvVar8 == (void *)0x0) {
                        lVar7 = 0;
                      }
                      else {
                        memcpy((void *)(lVar7 + (long)pvVar8),local_138 + uVar16,~uVar16 + uVar13);
                        lVar7 = (lVar7 - uVar16) + -1 + uVar13;
                      }
                      bVar10 = local_138[uVar13 - 1];
                      if ((bVar10 == 10) && (lVar7 != 0)) {
                        lVar7 = lVar7 - (ulong)(*(char *)((long)pvVar8 + lVar7 + -1) == '\r');
                      }
                      if (pvVar8 != (void *)0x0) {
                        *(undefined1 *)((long)pvVar8 + lVar7) = 0;
                      }
                      if (local_184 == 0 || (int)local_160 == 0) {
                        xlsxiowrite_add_cell_string(local_170,pvVar8);
                      }
                      else {
                        xlsxiowrite_add_column(local_170,pvVar8,0);
                      }
                      free(pvVar8);
                      bVar2 = true;
                      uVar16 = lVar14 + 1;
                      if (bVar10 == 10) {
                        xlsxiowrite_next_row();
                        pvVar8 = (void *)0x0;
                        lVar7 = 0;
                        local_184 = 0;
                      }
                      else {
                        pvVar8 = (void *)0x0;
                        lVar7 = 0;
                      }
                    }
                    else {
                      bVar2 = true;
                      if (bVar1 == 0x22) {
                        lVar9 = (lVar7 + (ulong)(bVar10 == 0x22)) - uVar16;
                        pvVar8 = realloc(pvVar8,lVar9 + uVar13);
                        if (pvVar8 == (void *)0x0) {
                          lVar7 = 0;
                        }
                        else {
                          memcpy((void *)(lVar7 + (long)pvVar8),local_138 + uVar16,
                                 ((bVar10 == 0x22) - uVar16) + -1 + uVar13);
                          lVar7 = lVar9 + uVar13 + -1;
                        }
                        uVar16 = lVar14 + 1;
                        goto LAB_00101838;
                      }
                    }
                  }
                  else if (bVar1 == 0x22) {
                    pvVar8 = realloc(pvVar8,(lVar7 - uVar16) + uVar13);
                    bVar2 = true;
                    if (pvVar8 == (void *)0x0) {
                      lVar7 = 0;
                      uVar16 = uVar13;
                    }
                    else {
                      memcpy((void *)((long)pvVar8 + lVar7),local_138 + uVar16,~uVar16 + uVar13);
                      lVar7 = (lVar7 - uVar16) + uVar13 + -1;
                      uVar16 = uVar13;
                    }
                  }
                  else {
LAB_00101838:
                    bVar2 = false;
                  }
                  bVar10 = local_138[uVar13 - 1];
                  lVar14 = lVar14 + 1;
                  lVar9 = local_140 + uVar13;
                  uVar13 = uVar13 + 1;
                } while (lVar9 != 0);
                local_178 = realloc(pvVar8,(lVar7 - uVar16) + uVar13);
                if (local_178 == (void *)0x0) {
                  lVar7 = 0;
                }
                else {
                  memcpy((void *)(lVar7 + (long)local_178),local_138 + uVar16,~uVar16 + uVar13);
                  lVar7 = (lVar7 - uVar16) + uVar13 + -1;
                }
                sVar6 = fread(local_138,1,0x100,local_190);
              } while (sVar6 != 0);
            }
            xlsxiowrite_close(local_170);
            free(local_178);
            __s_00 = local_158;
            argv = local_180;
            uVar16 = local_150;
            argc = local_194;
          }
          fclose(local_190);
          pcVar5 = local_148;
        }
        free(pcVar5);
        free(__s_00);
        uVar13 = uVar16;
      }
      uVar15 = (int)uVar13 + 1;
      uVar16 = (ulong)uVar15;
    } while ((int)uVar15 < argc);
  }
  return 0;
}

Assistant:

int main (int argc, char* argv[])
{
  int i;
  char* param;
  FILE* src;
  char separator = ',';
  char quote = '"';
  int toprowheaders = 0;
  xlsxiowriter xlsxiowrite;
  char* sheetname;
  char* filename;
  size_t xlsxdetectionrows = DEFAULT_DETECTION_ROWS;
  //process command line parameters
  if (argc == 1) {
    show_help();
    return 0;
  }
  for (i = 1; i < argc; i++) {
    //check for command line parameters
    if (argv[i][0] && (argv[i][0] == '/' || argv[i][0] == '-')) {
      switch (tolower(argv[i][1])) {
        case 'h' :
        case '?' :
          show_help();
          return 0;
        case 's' :
          if (argv[i][2])
            param = argv[i] + 2;
          else if (i + 1 < argc && argv[i + 1])
            param = argv[++i];
          else
            param = NULL;
          if (param)
            separator = param[0];
          continue;
        case 'd' :
          if (argv[i][2])
            param = argv[i] + 2;
          else if (i + 1 < argc && argv[i + 1])
            param = argv[++i];
          else
            param = NULL;
          if (param)
            xlsxdetectionrows = strtol(param, (char**)NULL, 10);
          continue;
        case 't' :
          toprowheaders = 1;
          continue;
      }
    }
    //open CSV file
    sheetname = NULL;
    filename = NULL;
    src = NULL;
    if (strcmp(argv[i], "-") == 0) {
      src = stdin;
#ifdef _WIN32
      setmode(fileno(stdin), O_BINARY);
#endif
      sheetname = strdup("Sheet1");
      filename = strdup("data.xlsx");
    } else if ((src = fopen(argv[i], "rb")) == NULL) {
      fprintf(stderr, "Error opening file: %s\n", argv[i]);
    } else {
      //determine sheetname
      if ((sheetname = strdup(argv[i])) != NULL) {
        char* p;
        int i;
        //strip extension
        if ((p = strrchr(sheetname, '.')) != NULL)
          *p = 0;
        //strip path
        i = strlen(sheetname);
        while (i-- > 0) {
          if (sheetname[i] == '/'
#ifdef _WIN32
            || sheetname[i] == '\\'
#endif
          ) {
            memmove(sheetname, sheetname + i + 1, strlen(sheetname) - i);
            break;
          }
        }
      }
      //determine output filename
      if ((filename = (char*)malloc(strlen(argv[i]) + 6)) == NULL ){
        fprintf(stderr, "Memory allocation error\n");
      } else {
        strcpy(filename, argv[i]);
        strcat(filename, ".xlsx");
      }
    }
    if (src && filename && sheetname) {
      //create .xslx file
      if ((xlsxiowrite = xlsxiowrite_open(filename, sheetname)) != NULL) {
        xlsxiowrite_set_detection_rows(xlsxiowrite, xlsxdetectionrows);
        xlsxiowrite_set_row_height(xlsxiowrite, 1);
        //skip UTF-8 BOM header if present
        unsigned char bom[3];
        if (!(fread(bom, 1, 3, src) == 3 && bom[0] == 0xEF && bom[1] == 0xBB && bom[2] == 0xBF)) {
          fseek(src, 0, SEEK_SET);
        }
        //process CSV file
        char buf[BUFFER_SIZE];
        size_t buflen = 0;
        size_t bufstart = 0;
        size_t bufpos = 0;
        char* value = NULL;
        size_t valuelen = 0;
        size_t unquoted = 1;
        char lastchar = 0;
        int toprow = 1;
        //read data one buffer at a tome
        while ((buflen = fread(buf, 1, BUFFER_SIZE, src)) > 0) {
          //process each character in buffer
          while (bufpos < buflen) {
            if (unquoted) {
              if (buf[bufpos] == separator || buf[bufpos] == '\n') {
                //process end of cell
                append_buffer_data(&value, &valuelen, buf + bufstart, bufpos - bufstart);
                bufstart = bufpos + 1;
                //detect CRLF line breaks and skip CR
                if (buf[bufpos] == '\n' && valuelen > 0 && value[valuelen - 1] == '\r')
                  valuelen--;
                //write cell value
                if (value)
                  value[valuelen] = 0;
                if (toprow && toprowheaders)
                  xlsxiowrite_add_column(xlsxiowrite, value, 0);
                else
                  xlsxiowrite_add_cell_string(xlsxiowrite, value);
                //clean up cell value
                free(value);
                value = NULL;
                valuelen = 0;
                //process end of line
                if (buf[bufpos] == '\n') {
                  xlsxiowrite_next_row(xlsxiowrite);
                  toprow = 0;
                }
              } else if (buf[bufpos] == quote) {
                //process upen quote
                append_buffer_data(&value, &valuelen, buf + bufstart, bufpos - bufstart + (lastchar == quote ? 1 : 0));
                bufstart = bufpos + 1;
                unquoted = 0;
              }
            } else if (buf[bufpos] == quote) {
              //process close quote
              append_buffer_data(&value, &valuelen, buf + bufstart, bufpos - bufstart);
              bufstart = bufpos + 1;
              unquoted = 1;
            }
            //prepare for processing next character
            lastchar = buf[bufpos];
            bufpos++;
          }
          //dump data at end of buffer and reset counters
          append_buffer_data(&value, &valuelen, buf + bufstart, bufpos - bufstart);
          bufstart = 0;
          bufpos = 0;
        }
        //close .xlsx file
        xlsxiowrite_close(xlsxiowrite);
        //clean up
        free(value);
      }
      //close CSV file
      fclose(src);
    }
    //clean up
    free(filename);
    free(sheetname);
  }
  return 0;
}